

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

shared_ptr<mocker::ir::Reg> __thiscall
mocker::ir::Builder::getMemberElementPtr
          (Builder *this,shared_ptr<mocker::ir::Addr> *base,string *className,string *varName)

{
  string *hint;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string *in_R8;
  shared_ptr<mocker::ir::Reg> sVar1;
  shared_ptr<mocker::ir::AttachedComment> attachedComment;
  shared_ptr<mocker::ir::IntLiteral> offsetLit;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_98 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  shared_ptr<mocker::ir::IRInst> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::operator+(&local_50,"getElementPtr: ",varName);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_98 + 0x10),&local_50,"::");
  std::operator+(&local_b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_98 + 0x10),in_R8);
  std::make_shared<mocker::ir::AttachedComment,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)(local_98 + 0x10));
  std::__cxx11::string::~string((string *)&local_50);
  local_68.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_98._0_8_;
  local_68.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_;
  local_98._0_8_ = (pointer)0x0;
  local_98._8_8_ = 0;
  BuilderContext::appendInst
            ((BuilderContext *)
             (base->super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi,&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  local_b8._M_dataplus._M_p =
       (pointer)BuilderContext::getOffset
                          ((BuilderContext *)
                           (base->super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>).
                           _M_refcount._M_pi,varName,in_R8);
  std::make_shared<mocker::ir::IntLiteral,long>((long *)(local_98 + 0x10));
  hint = (string *)
         (base->super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"varPtr",(allocator<char> *)&local_50);
  BuilderContext::makeTempLocalReg((BuilderContext *)this,hint);
  std::__cxx11::string::~string((string *)&local_b8);
  local_b8._M_dataplus._M_p._0_4_ = 5;
  BuilderContext::
  emplaceInst<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::ArithBinaryInst::OpType,std::shared_ptr<mocker::ir::Addr>const&,std::shared_ptr<mocker::ir::IntLiteral>&>
            ((BuilderContext *)
             (base->super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi,(shared_ptr<mocker::ir::Reg> *)this,(OpType *)&local_b8,
             (shared_ptr<mocker::ir::Addr> *)className,
             (shared_ptr<mocker::ir::IntLiteral> *)(local_98 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88._M_string_length);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
  sVar1.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ir::Reg>)
         sVar1.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Reg>
Builder::getMemberElementPtr(const std::shared_ptr<Addr> &base,
                             const std::string &className,
                             const std::string &varName) const {
  auto attachedComment = std::make_shared<AttachedComment>(
      "getElementPtr: " + className + "::" + varName);
  ctx.appendInst(std::move(attachedComment));

  std::size_t offset = ctx.getOffset(className, varName);
  auto offsetLit = std::make_shared<IntLiteral>((Integer)offset);
  auto varPtr = ctx.makeTempLocalReg("varPtr");
  ctx.emplaceInst<ArithBinaryInst>(varPtr, ArithBinaryInst::Add, base,
                                   offsetLit);
  return varPtr;
}